

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSerialize.h
# Opt level: O1

void __thiscall TTD::FileWriter::WriteRawByteBuff_Fixed<char16_t>(FileWriter *this,char16_t *data)

{
  byte *dst;
  ulong uVar1;
  
  dst = ReserveSpaceForSmallData<2ul>(this);
  js_memcpy_s(dst,2,data,2);
  uVar1 = this->m_cursor + 2;
  if (uVar1 < 0x200000) {
    this->m_cursor = uVar1;
    return;
  }
  TTDAbort_unrecoverable_error("Must have already reserved the space!");
}

Assistant:

void WriteRawByteBuff_Fixed(const T& data)
        {
            byte* trgt = this->ReserveSpaceForSmallData<sizeof(T)>();

            js_memcpy_s(trgt, sizeof(T), (const byte*)(&data), sizeof(T));

            this->CommitSpaceForSmallData(sizeof(T));
        }